

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O1

void __thiscall CConsoleNetConnection::Disconnect(CConsoleNetConnection *this,char *pReason)

{
  if (this->m_State != 0) {
    if ((pReason != (char *)0x0) && (*pReason != '\0')) {
      Send(this,pReason);
    }
    net_tcp_close(this->m_Socket);
    this->m_State = 0;
    mem_zero(&this->m_PeerAddr,0x18);
    this->m_aErrorString[0] = '\0';
    (this->m_Socket).type = 0;
    (this->m_Socket).ipv4sock = -1;
    (this->m_Socket).ipv6sock = -1;
    this->m_aBuffer[0] = '\0';
    this->m_BufferOffset = 0;
    this->m_LineEndingDetected = false;
    this->m_aLineEnding[0] = '\n';
    this->m_aLineEnding[1] = '\0';
    this->m_aLineEnding[2] = '\0';
  }
  return;
}

Assistant:

void CConsoleNetConnection::Disconnect(const char *pReason)
{
	if(State() == NET_CONNSTATE_OFFLINE)
		return;

	if(pReason && pReason[0])
		Send(pReason);

	net_tcp_close(m_Socket);

	Reset();
}